

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O1

DecoderResult *
ZXing::Pdf417::ScanningDecoder::Decode
          (DecoderResult *__return_storage_ptr__,BitMatrix *image,
          Nullable<ZXing::ResultPoint> *imageTopLeft,Nullable<ZXing::ResultPoint> *imageBottomLeft,
          Nullable<ZXing::ResultPoint> *imageTopRight,Nullable<ZXing::ResultPoint> *imageBottomRight
          ,int minCodewordWidth,int maxCodewordWidth)

{
  undefined8 uVar1;
  pointer pNVar2;
  pointer pNVar3;
  RowIndicator rowIndicator;
  void *pvVar4;
  pointer pvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  vector<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
  *pvVar14;
  byte bVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  pointer pvVar20;
  pointer *ppiVar21;
  vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_> *row;
  pointer this;
  pointer pNVar22;
  uint uVar23;
  DetectionResultColumn *pDVar24;
  BoundingBox *pBVar25;
  DetectionResultColumn *pDVar26;
  undefined8 *puVar27;
  ulong uVar28;
  BoundingBox *pBVar29;
  DetectionResultColumn *pDVar30;
  pointer pNVar31;
  undefined1 auVar32 [8];
  Nullable<ZXing::Pdf417::Codeword> *codeword_1;
  uint uVar33;
  int startColumn;
  long lVar34;
  byte bVar35;
  ResultPoint RVar36;
  BarcodeMetadata barcodeMetadata;
  vector<int,_std::allocator<int>_> ambiguousIndexesList;
  BarcodeMetadata leftBarcodeMetadata;
  vector<int,_std::allocator<int>_> erasures;
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  barcodeMatrix;
  Nullable<ZXing::Pdf417::BoundingBox> rightBox;
  vector<int,_std::allocator<int>_> codewords;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ambiguousIndexValues;
  DetectionResult detectionResult;
  BoundingBox boundingBox;
  int local_57c;
  uint local_578;
  vector<int,_std::allocator<int>_> local_568;
  void *local_548;
  iterator iStack_540;
  int *local_538;
  undefined1 local_528 [12];
  int iStack_51c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  pointer local_508;
  short local_500;
  Type TStack_4fe;
  undefined5 uStack_4fd;
  _Alloc_hider local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0 [2];
  _Alloc_hider local_4c0;
  undefined1 local_4b0 [16];
  pointer local_4a0;
  _Alloc_hider local_498;
  RowIndicator local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  Type local_46e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  BitMatrix *local_450;
  vector<int,_std::allocator<int>_> local_448;
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  local_430;
  undefined1 local_418 [8];
  undefined8 uStack_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  char *local_3f8;
  short local_3f0;
  Type local_3ee;
  pointer local_3a0;
  pointer pNStack_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_390;
  RowIndicator local_388;
  vector<int,_std::allocator<int>_> local_380;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_368;
  DetectionResult local_348;
  long local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  double dStack_278;
  uint local_270;
  Nullable<ZXing::Pdf417::DetectionResultColumn> local_268;
  Nullable<ZXing::Pdf417::DetectionResultColumn> local_1c8;
  BoundingBox local_128;
  Nullable<ZXing::ResultPoint> *local_b0;
  BoundingBox local_a8;
  
  bVar35 = 0;
  BoundingBox::BoundingBox(&local_128);
  local_450 = image;
  bVar8 = BoundingBox::Create(image->_width,image->_height,imageTopLeft,imageBottomLeft,
                              imageTopRight,imageBottomRight,&local_128);
  if (!bVar8) {
    memset(__return_storage_ptr__,0,0xd0);
    DecoderResult::DecoderResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_1c8.m_hasValue = false;
  BoundingBox::BoundingBox(&local_1c8.m_value._boundingBox);
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_1c8.m_value._rowIndicator = None;
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  pDVar26 = &local_268.m_value;
  local_268.m_hasValue = false;
  BoundingBox::BoundingBox(&pDVar26->_boundingBox);
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_268.m_value._rowIndicator = None;
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  DetectionResult::DetectionResult(&local_348);
  local_57c = minCodewordWidth;
  bVar8 = true;
  do {
    if (imageTopLeft->m_hasValue != false) {
      RVar36 = Nullable::operator_cast_to_ResultPoint((Nullable *)imageTopLeft);
      uStack_410 = RVar36.super_PointF.y;
      local_418 = (undefined1  [8])RVar36.super_PointF.x;
      GetRowIndicatorColumn
                ((DetectionResultColumn *)local_528,local_450,&local_128,(ResultPoint *)local_418,
                 true,minCodewordWidth,maxCodewordWidth);
      local_1c8.m_hasValue = true;
      pDVar24 = (DetectionResultColumn *)local_528;
      pDVar30 = &local_1c8.m_value;
      for (lVar16 = 0xf;
          pNVar31 = local_1c8.m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar16 != 0; lVar16 = lVar16 + -1) {
        iVar12 = (pDVar24->_boundingBox)._imgHeight;
        (pDVar30->_boundingBox)._imgWidth = (pDVar24->_boundingBox)._imgWidth;
        (pDVar30->_boundingBox)._imgHeight = iVar12;
        pDVar24 = (DetectionResultColumn *)((long)pDVar24 + (ulong)bVar35 * -0x10 + 8);
        pDVar30 = (DetectionResultColumn *)((long)pDVar30 + ((ulong)bVar35 * -2 + 1) * 8);
      }
      lVar16 = CONCAT44(local_1c8.m_value._codewords.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        local_1c8.m_value._codewords.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4b0._0_8_;
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)local_4b0._8_8_;
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(local_4b0._8_8_,4);
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(local_4a0,0);
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (undefined4)((ulong)local_4a0 >> 0x20);
      local_4b0._0_8_ = (pointer)0x0;
      local_4b0._8_8_ = (pointer)0x0;
      local_4a0 = (pointer)0x0;
      if (pNVar31 != (pointer)0x0) {
        operator_delete(pNVar31,lVar16 - (long)pNVar31);
      }
      local_1c8.m_value._rowIndicator = (RowIndicator)local_498._M_p;
      if ((pointer)local_4b0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_4b0._0_8_,(long)local_4a0 - local_4b0._0_8_);
      }
    }
    if (imageTopRight->m_hasValue == true) {
      RVar36 = Nullable::operator_cast_to_ResultPoint((Nullable *)imageTopRight);
      uStack_410 = RVar36.super_PointF.y;
      local_418 = (undefined1  [8])RVar36.super_PointF.x;
      GetRowIndicatorColumn
                ((DetectionResultColumn *)local_528,local_450,&local_128,(ResultPoint *)local_418,
                 false,minCodewordWidth,maxCodewordWidth);
      local_268.m_hasValue = true;
      pDVar24 = (DetectionResultColumn *)local_528;
      pDVar30 = pDVar26;
      for (lVar16 = 0xf;
          pNVar31 = local_268.m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar16 != 0; lVar16 = lVar16 + -1) {
        iVar12 = (pDVar24->_boundingBox)._imgHeight;
        (pDVar30->_boundingBox)._imgWidth = (pDVar24->_boundingBox)._imgWidth;
        (pDVar30->_boundingBox)._imgHeight = iVar12;
        pDVar24 = (DetectionResultColumn *)((long)pDVar24 + (ulong)bVar35 * -0x10 + 8);
        pDVar30 = (DetectionResultColumn *)((long)pDVar30 + (ulong)bVar35 * -0x10 + 8);
      }
      lVar16 = CONCAT44(local_268.m_value._codewords.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        local_268.m_value._codewords.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4b0._0_8_;
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)local_4b0._8_8_;
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(local_4b0._8_8_,4);
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(local_4a0,0);
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (undefined4)((ulong)local_4a0 >> 0x20);
      local_4b0._0_8_ = (pointer)0x0;
      local_4b0._8_8_ = (pointer)0x0;
      local_4a0 = (pointer)0x0;
      if (pNVar31 != (pointer)0x0) {
        operator_delete(pNVar31,lVar16 - (long)pNVar31);
      }
      local_268.m_value._rowIndicator = (RowIndicator)local_498._M_p;
      if ((pointer)local_4b0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_4b0._0_8_,(long)local_4a0 - local_4b0._0_8_);
      }
    }
    if (local_1c8.m_hasValue == false) {
      if (local_268.m_hasValue == true) {
        local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_528._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        stack0xfffffffffffffae0 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        goto LAB_001798b6;
      }
LAB_00179980:
      bVar9 = false;
    }
    else {
      local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_528._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      stack0xfffffffffffffae0 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      bVar9 = DetectionResultColumn::getBarcodeMetadata
                        (&local_1c8.m_value,(BarcodeMetadata *)local_528);
      if (bVar9) {
        local_418 = (undefined1  [8])0x0;
        uStack_410 = 0.0;
        if ((local_268.m_hasValue == true) &&
           (bVar9 = DetectionResultColumn::getBarcodeMetadata(pDVar26,(BarcodeMetadata *)local_418),
           bVar9)) {
          if (local_528._0_4_ != local_418._0_4_) {
            if (local_528._4_4_ != local_418._4_4_) {
              if (iStack_51c + local_528._8_4_ != uStack_410._4_4_ + (int)uStack_410) {
                bVar9 = false;
                goto LAB_001798d1;
              }
            }
          }
        }
        local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)local_528._0_8_;
        local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)stack0xfffffffffffffae0;
        bVar9 = true;
      }
      else {
LAB_001798b6:
        if (local_268.m_hasValue != true) goto LAB_00179980;
        bVar9 = DetectionResultColumn::getBarcodeMetadata(pDVar26,(BarcodeMetadata *)&local_568);
      }
LAB_001798d1:
      if (bVar9 == false) goto LAB_00179980;
      local_528._0_8_ = local_528._0_8_ & 0xffffffffffffff00;
      BoundingBox::BoundingBox((BoundingBox *)(local_528 + 8));
      local_418 = (undefined1  [8])((ulong)local_418 & 0xffffffffffffff00);
      BoundingBox::BoundingBox((BoundingBox *)&uStack_410);
      local_b0 = (Nullable<ZXing::ResultPoint> *)((ulong)local_b0 & 0xffffffffffffff00);
      BoundingBox::BoundingBox(&local_a8);
      bVar9 = AdjustBoundingBox(&local_1c8,(Nullable<ZXing::Pdf417::BoundingBox> *)local_528);
      if (((!bVar9) ||
          (bVar9 = AdjustBoundingBox(&local_268,(Nullable<ZXing::Pdf417::BoundingBox> *)local_418),
          !bVar9)) ||
         (bVar9 = BoundingBox::Merge((Nullable<ZXing::Pdf417::BoundingBox> *)local_528,
                                     (Nullable<ZXing::Pdf417::BoundingBox> *)local_418,
                                     (Nullable<ZXing::Pdf417::BoundingBox> *)&local_b0), !bVar9))
      goto LAB_00179980;
      DetectionResult::init(&local_348,(EVP_PKEY_CTX *)&local_568);
      bVar9 = true;
    }
    if (!bVar9) {
      memset(__return_storage_ptr__,0,0xd0);
      DecoderResult::DecoderResult(__return_storage_ptr__);
      goto LAB_00179a4c;
    }
    if (((!bVar8) || (local_348._boundingBox.m_hasValue != true)) ||
       ((local_128._minY <= local_348._boundingBox.m_value._minY &&
        (local_348._boundingBox.m_value._maxY <= local_128._maxY)))) break;
    Nullable::operator_cast_to_BoundingBox
              ((BoundingBox *)local_528,(Nullable *)&local_348._boundingBox);
    pDVar24 = (DetectionResultColumn *)local_528;
    pBVar25 = &local_128;
    for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
      iVar12 = (pDVar24->_boundingBox)._imgHeight;
      pBVar25->_imgWidth = (pDVar24->_boundingBox)._imgWidth;
      pBVar25->_imgHeight = iVar12;
      pDVar24 = (DetectionResultColumn *)((long)pDVar24 + (ulong)bVar35 * -0x10 + 8);
      pBVar25 = (BoundingBox *)((long)pBVar25 + (ulong)bVar35 * -0x10 + 8);
    }
    bVar8 = false;
  } while( true );
  local_348._boundingBox.m_hasValue = true;
  pBVar25 = &local_128;
  pBVar29 = &local_348._boundingBox.m_value;
  for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
    iVar12 = pBVar25->_imgHeight;
    pBVar29->_imgWidth = pBVar25->_imgWidth;
    pBVar29->_imgHeight = iVar12;
    pBVar25 = (BoundingBox *)((long)pBVar25 + ((ulong)bVar35 * -2 + 1) * 8);
    pBVar29 = (BoundingBox *)((long)pBVar29 + ((ulong)bVar35 * -2 + 1) * 8);
  }
LAB_00179a4c:
  pNVar22 = local_348._detectionResultColumns.
            super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar12 = local_348._barcodeMetadata._columnCount;
  if (!bVar9) goto LAB_0017a804;
  lVar16 = (long)local_348._barcodeMetadata._columnCount;
  (local_348._detectionResultColumns.
   super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_hasValue = local_1c8.m_hasValue;
  pDVar24 = &local_1c8.m_value;
  pDVar30 = &(local_348._detectionResultColumns.
              super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_value;
  for (lVar17 = 0xf; lVar17 != 0; lVar17 = lVar17 + -1) {
    iVar11 = (pDVar24->_boundingBox)._imgHeight;
    (pDVar30->_boundingBox)._imgWidth = (pDVar24->_boundingBox)._imgWidth;
    (pDVar30->_boundingBox)._imgHeight = iVar11;
    pDVar24 = (DetectionResultColumn *)((long)pDVar24 + ((ulong)bVar35 * -2 + 1) * 8);
    pDVar30 = (DetectionResultColumn *)((long)pDVar30 + (ulong)bVar35 * -0x10 + 8);
  }
  std::
  vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ::operator=(&((local_348._detectionResultColumns.
                 super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_value)._codewords,
              &local_1c8.m_value._codewords);
  pNVar2 = local_348._detectionResultColumns.
           super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = lVar16 + 1;
  (pNVar22->m_value)._rowIndicator = local_1c8.m_value._rowIndicator;
  local_348._detectionResultColumns.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
  ._M_impl.super__Vector_impl_data._M_start[lVar16].m_hasValue = local_268.m_hasValue;
  pDVar24 = &local_348._detectionResultColumns.
             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar16].m_value;
  for (lVar17 = 0xf; lVar17 != 0; lVar17 = lVar17 + -1) {
    iVar11 = (pDVar26->_boundingBox)._imgHeight;
    (pDVar24->_boundingBox)._imgWidth = (pDVar26->_boundingBox)._imgWidth;
    (pDVar24->_boundingBox)._imgHeight = iVar11;
    pDVar26 = (DetectionResultColumn *)((long)pDVar26 + (ulong)bVar35 * -0x10 + 8);
    pDVar24 = (DetectionResultColumn *)((long)pDVar24 + (ulong)bVar35 * -0x10 + 8);
  }
  std::
  vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ::operator=(&local_348._detectionResultColumns.
               super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar16].m_value._codewords,
              &local_268.m_value._codewords);
  bVar8 = local_1c8.m_hasValue;
  pNVar2[lVar16].m_value._rowIndicator = local_268.m_value._rowIndicator;
  if (-1 < iVar12) {
    uVar28 = (ulong)local_1c8.m_hasValue;
    local_578 = local_1c8.m_hasValue - 1 | 1;
    local_298 = (ulong)(iVar12 + 1);
    uVar13 = 1;
    local_2a0 = lVar16;
    local_288 = uVar28;
    do {
      iVar12 = (int)local_2a0 - (int)uVar13;
      if (bVar8 != false) {
        iVar12 = (int)uVar13;
      }
      local_290 = uVar13;
      if (local_348._detectionResultColumns.
          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar12].m_hasValue == false) {
        rowIndicator = (uint)(iVar12 == (int)local_2a0) * 2;
        if (iVar12 == 0) {
          rowIndicator = Left;
        }
        DetectionResultColumn::DetectionResultColumn
                  ((DetectionResultColumn *)local_418,&local_128,rowIndicator);
        local_528[0] = (Nullable)0x1;
        pDVar26 = (DetectionResultColumn *)local_418;
        puVar27 = (undefined8 *)(local_528 + 8);
        for (lVar16 = 0xf;
            pNVar22 = local_348._detectionResultColumns.
                      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, lVar16 != 0; lVar16 = lVar16 + -1)
        {
          *puVar27 = *(undefined8 *)&pDVar26->_boundingBox;
          pDVar26 = (DetectionResultColumn *)((long)pDVar26 + (ulong)bVar35 * -0x10 + 8);
          puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
        }
        local_4b0._8_8_ = local_3a0;
        local_4a0 = pNStack_398;
        local_498._M_p = (pointer)local_390;
        local_3a0 = (pointer)0x0;
        pNStack_398 = (pointer)0x0;
        local_390 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_490 = local_388;
        local_348._detectionResultColumns.
        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar12].m_hasValue = true;
        puVar27 = (undefined8 *)(local_528 + 8);
        pDVar26 = &local_348._detectionResultColumns.
                   super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar12].m_value;
        for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
          uVar1 = *puVar27;
          (pDVar26->_boundingBox)._imgWidth = (int)uVar1;
          (pDVar26->_boundingBox)._imgHeight = (int)((ulong)uVar1 >> 0x20);
          puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
          pDVar26 = (DetectionResultColumn *)((long)pDVar26 + (ulong)bVar35 * -0x10 + 8);
        }
        std::
        vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
        ::operator=(&local_348._detectionResultColumns.
                     super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar12].m_value._codewords,
                    (vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                     *)(local_4b0 + 8));
        pNVar22[iVar12].m_value._rowIndicator = local_490;
        if ((pointer)local_4b0._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_4b0._8_8_,(long)local_498._M_p - local_4b0._8_8_);
        }
        if (local_3a0 != (pointer)0x0) {
          operator_delete(local_3a0,(long)local_390 - (long)local_3a0);
        }
        if (local_128._minY <= local_128._maxY) {
          uVar33 = iVar12 - local_578;
          uVar13 = (ulong)uVar33;
          iVar19 = -1;
          iVar11 = local_128._minY;
          do {
            iVar10 = 0;
            if ((int)uVar33 < 0) {
              bVar15 = 0;
              startColumn = 0;
            }
            else {
              bVar15 = 0;
              startColumn = 0;
              iVar10 = 0;
              if ((int)uVar33 <= local_348._barcodeMetadata._columnCount + 1) {
                lVar16 = (long)iVar11 -
                         (long)local_348._detectionResultColumns.
                               super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar13].m_value.
                               _boundingBox._minY;
                pNVar31 = local_348._detectionResultColumns.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar13].m_value._codewords.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar15 = pNVar31[lVar16].m_hasValue;
                startColumn = pNVar31[lVar16].m_value._startX;
                iVar10 = pNVar31[lVar16].m_value._endX;
              }
            }
            if ((bVar15 & 1) == 0) {
              DetectionResultColumn::codewordNearby
                        ((Nullable<ZXing::Pdf417::Codeword> *)local_528,
                         &local_348._detectionResultColumns.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar12].m_value,iVar11);
              uVar18 = local_528._0_8_ & 0xff;
              iVar10 = local_528._4_4_;
              startColumn = local_528._8_4_;
              if ((local_528._0_8_ & 1) != 0) goto LAB_00179d67;
              if ((-1 < (int)uVar33) && ((int)uVar33 <= local_348._barcodeMetadata._columnCount + 1)
                 ) {
                DetectionResultColumn::codewordNearby
                          ((Nullable<ZXing::Pdf417::Codeword> *)local_528,
                           &local_348._detectionResultColumns.
                            super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar13].m_value,iVar11);
                uVar18 = local_528._0_8_ & 0xff;
                startColumn = local_528._8_4_;
              }
              if ((uVar18 & 1) == 0) {
                if ((int)uVar33 <= local_348._barcodeMetadata._columnCount + 1 && -1 < (int)uVar33)
                {
                  iVar10 = 0;
                  uVar18 = uVar13;
                  do {
                    pNVar31 = local_348._detectionResultColumns.
                              super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar18].m_value._codewords.
                              super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pNVar3 = local_348._detectionResultColumns.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar18].m_value._codewords.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    bVar9 = pNVar31 == pNVar3;
                    if (!bVar9) {
                      bVar9 = false;
                      do {
                        if (pNVar31->m_hasValue == true) {
                          startColumn = ((pNVar31->m_value)._endX - (pNVar31->m_value)._startX) *
                                        iVar10 * local_578 + (&(pNVar31->m_value)._startX)[uVar28];
                        }
                        if (pNVar31->m_hasValue != false) break;
                        pNVar31 = pNVar31 + 1;
                        bVar9 = pNVar31 == pNVar3;
                      } while (!bVar9);
                    }
                    if (!bVar9) goto LAB_00179d70;
                    uVar23 = (int)uVar18 - local_578;
                    uVar18 = (ulong)uVar23;
                  } while ((-1 < (int)uVar23) &&
                          (iVar10 = iVar10 + 1,
                          (int)uVar23 <= local_348._barcodeMetadata._columnCount + 1));
                }
                startColumn = local_348._boundingBox.m_value._maxX;
                if (bVar8 != false) {
                  startColumn = local_348._boundingBox.m_value._minX;
                }
              }
              else if (bVar8 == false) {
                startColumn = local_528._4_4_;
              }
            }
            else {
LAB_00179d67:
              if (bVar8 != false) {
                startColumn = iVar10;
              }
            }
LAB_00179d70:
            if (((startColumn < 0) || (local_128._maxX < startColumn)) &&
               (startColumn = iVar19, iVar19 == -1)) {
              iVar19 = -1;
            }
            else {
              DetectCodeword((Nullable<ZXing::Pdf417::Codeword> *)local_528,local_450,
                             local_128._minX,local_128._maxX,SUB81(local_288,0),startColumn,iVar11,
                             local_57c,maxCodewordWidth);
              pNVar22 = local_348._detectionResultColumns.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_528[0] == (Nullable)0x1) {
                Nullable::operator_cast_to_Codeword((Codeword *)&local_280,(Nullable *)local_528);
                local_408._M_allocated_capacity._0_4_ = local_270;
                local_418 = (undefined1  [8])local_280;
                uStack_410 = dStack_278;
                lVar16 = (long)iVar11 - (long)pNVar22[iVar12].m_value._boundingBox._minY;
                pNVar31 = pNVar22[iVar12].m_value._codewords.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pNVar31[lVar16].m_hasValue = true;
                pNVar31[lVar16].m_value._rowNumber = local_270;
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)&pNVar31[lVar16].m_value = local_280;
                *(double *)&pNVar31[lVar16].m_value._bucket = dStack_278;
                iVar10 = local_528._8_4_ - local_528._4_4_;
                if (iVar10 <= local_57c) {
                  local_57c = iVar10;
                }
                iVar19 = startColumn;
                if (maxCodewordWidth <= iVar10) {
                  maxCodewordWidth = iVar10;
                }
              }
            }
            bVar9 = iVar11 < local_128._maxY;
            iVar11 = iVar11 + 1;
          } while (bVar9);
        }
      }
      uVar13 = (ulong)((int)local_290 + 1);
    } while ((int)local_290 != (int)local_298);
  }
  std::
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  ::vector(&local_430,
           (long)local_348._barcodeMetadata._rowCountLowerPart +
           (long)local_348._barcodeMetadata._rowCountUpperPart,(allocator_type *)local_528);
  pvVar5 = local_430.
           super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this = local_430.
              super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != pvVar5; this = this + 1) {
    std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>::resize
              (this,(long)local_348._barcodeMetadata._columnCount + 2);
  }
  pvVar14 = DetectionResult::allColumns(&local_348);
  pNVar22 = (pvVar14->
            super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (pvVar14->
           super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar22 != pNVar2) {
    lVar16 = 0;
    do {
      if (pNVar22->m_hasValue == true) {
        pNVar3 = (pNVar22->m_value)._codewords.
                 super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pNVar31 = (pNVar22->m_value)._codewords.
                       super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pNVar31 != pNVar3;
            pNVar31 = (pointer)((long)pNVar31 + 0x18)) {
          if (pNVar31->m_hasValue == true) {
            iVar12 = ((Codeword *)((long)pNVar31 + 0x14))->_startX;
            if ((-1 < (long)iVar12) &&
               (iVar11 = (int)((ulong)((long)local_430.
                                             super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_430.
                                            super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3),
               SBORROW4(iVar12,iVar11 * -0x55555555) != iVar12 + iVar11 * 0x55555555 < 0)) {
              BarcodeValue::setValue
                        ((((vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                            *)((long)local_430.
                                     super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + (long)iVar12 * 0x18
                              ))->
                         super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar16,
                         ((Codeword *)((long)pNVar31 + 0x10))->_startX);
            }
          }
        }
      }
      lVar16 = lVar16 + 1;
      pNVar22 = pNVar22 + 1;
    } while (pNVar22 != pNVar2);
  }
  BarcodeValue::value((vector<int,_std::allocator<int>_> *)local_528,
                      ((local_430.
                        super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1);
  iVar11 = (local_348._barcodeMetadata._rowCountLowerPart +
           local_348._barcodeMetadata._rowCountUpperPart) * local_348._barcodeMetadata._columnCount;
  iVar19 = -2 << ((byte)local_348._barcodeMetadata._errorCorrectionLevel & 0x1f);
  iVar12 = 0;
  if (0xfffffc5f < (iVar19 + iVar11) - 0x3a1U) {
    iVar12 = iVar19 + iVar11;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._0_8_ == stack0xfffffffffffffae0) {
    if (iVar12 != 0) goto LAB_0017a123;
    bVar8 = false;
  }
  else {
    bVar8 = true;
    if ((iVar12 != 0) && (*(int *)local_528._0_8_ != iVar12)) {
LAB_0017a123:
      bVar8 = true;
      BarcodeValue::setValue
                (((local_430.
                   super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,iVar12);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_528._0_8_,
                    CONCAT71(local_518._M_allocated_capacity._1_7_,local_518._M_local_buf[0]) -
                    local_528._0_8_);
  }
  if (bVar8) {
    local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_528._0_8_ = local_528._0_8_ & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_380,
               (long)local_348._barcodeMetadata._columnCount *
               ((long)local_348._barcodeMetadata._rowCountLowerPart +
               (long)local_348._barcodeMetadata._rowCountUpperPart),
               (value_type_conflict3 *)local_528,(allocator_type *)local_418);
    local_368.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_538 = (int *)0x0;
    local_548 = (void *)0x0;
    iStack_540._M_current = (int *)0x0;
    if (local_348._barcodeMetadata._rowCountLowerPart +
        local_348._barcodeMetadata._rowCountUpperPart != 0 &&
        SCARRY4(local_348._barcodeMetadata._rowCountLowerPart,
                local_348._barcodeMetadata._rowCountUpperPart) ==
        local_348._barcodeMetadata._rowCountLowerPart +
        local_348._barcodeMetadata._rowCountUpperPart < 0) {
      lVar16 = 0;
      do {
        if (0 < local_348._barcodeMetadata._columnCount) {
          lVar17 = 0x30;
          lVar34 = 0;
          do {
            BarcodeValue::value((vector<int,_std::allocator<int>_> *)local_528,
                                (BarcodeValue *)
                                ((long)&((local_430.
                                          super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar16].
                                          super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_values)._M_t.
                                        _M_impl + lVar17));
            iVar12 = local_348._barcodeMetadata._columnCount * (int)lVar16 + (int)lVar34;
            local_418._0_4_ = iVar12;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._0_8_ == stack0xfffffffffffffae0) {
              if (local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_448,
                           (iterator)
                           local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)local_418);
              }
              else {
                *local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar12;
                local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            else if ((long)stack0xfffffffffffffae0 - local_528._0_8_ == 4) {
              local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12] = *(int *)local_528._0_8_;
            }
            else {
              if (iStack_540._M_current == local_538) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_548,iStack_540,(int *)local_418
                          );
              }
              else {
                *iStack_540._M_current = iVar12;
                iStack_540._M_current = iStack_540._M_current + 1;
              }
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::push_back(&local_368,(vector<int,_std::allocator<int>_> *)local_528);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_528._0_8_,
                              CONCAT71(local_518._M_allocated_capacity._1_7_,
                                       local_518._M_local_buf[0]) - local_528._0_8_);
            }
            lVar34 = lVar34 + 1;
            lVar17 = lVar17 + 0x30;
          } while (lVar34 < local_348._barcodeMetadata._columnCount);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (long)local_348._barcodeMetadata._rowCountLowerPart +
                        (long)local_348._barcodeMetadata._rowCountUpperPart);
    }
    local_528._0_8_ = local_528._0_8_ & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_568,(long)iStack_540._M_current - (long)local_548 >> 2,
               (value_type_conflict3 *)local_528,(allocator_type *)local_418);
    iVar12 = 99;
    do {
      if ((long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar16 = (long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar17 = 0;
        pvVar20 = local_368.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[*(int *)((long)local_548 + lVar17 * 4)] =
               (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start
               [*(int *)((long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar17 * 4)];
          lVar17 = lVar17 + 1;
          pvVar20 = pvVar20 + 1;
        } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
      }
      DecodeCodewords((DecoderResult *)local_528,&local_380,
                      1 << ((byte)local_348._barcodeMetadata._errorCorrectionLevel + 1 & 0x1f),
                      &local_448);
      uVar7 = local_408._M_allocated_capacity._4_4_;
      uVar6 = local_408._M_allocated_capacity._0_4_;
      if (local_46e != Checksum) {
        DecoderResult::DecoderResult(__return_storage_ptr__,(DecoderResult *)local_528);
LAB_0017a6cf:
        if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_p != &local_488) {
          operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
        }
        if (local_4c0._M_p != local_4b0) {
          operator_delete(local_4c0._M_p,(ulong)(local_4b0._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_p != local_4e0) {
          operator_delete(local_4f0._M_p,local_4e0[0]._M_allocated_capacity + 1);
        }
        pvVar4 = (void *)CONCAT17(local_518._M_local_buf[0xf],
                                  CONCAT25(local_518._13_2_,
                                           CONCAT41(local_518._9_4_,local_518._M_local_buf[8])));
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,CONCAT53(uStack_4fd,CONCAT12(TStack_4fe,local_500)) - (long)pvVar4)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_0017a782;
        uVar28 = CONCAT71(local_518._M_allocated_capacity._1_7_,local_518._M_local_buf[0]) -
                 local_528._0_8_;
        auVar32 = (undefined1  [8])local_528._0_8_;
        goto LAB_0017a77d;
      }
      local_408._M_allocated_capacity._1_3_ = local_a8._topLeft._1_3_;
      local_408._M_allocated_capacity._4_4_ = local_a8._topLeft._4_4_;
      if (local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        local_b0 = &local_a8._topLeft;
        local_a8._imgWidth = 0;
        local_a8._imgHeight = 0;
        local_418 = (undefined1  [8])&local_408;
        local_408._M_allocated_capacity._0_4_ =
             (uint)(uint3)local_408._M_allocated_capacity._1_3_ << 8;
        local_408._9_4_ = local_a8._topLeft.m_value.super_PointF.x._1_4_;
        local_408._13_2_ = local_a8._topLeft.m_value.super_PointF.x._5_2_;
        local_408._M_local_buf[0xf] = local_a8._topLeft.m_value.super_PointF.x._7_1_;
        uStack_410 = 0.0;
        local_a8._topLeft.m_hasValue = false;
        local_3f8 = "src/pdf417/PDFScanningDecoder.cpp";
        local_3f0 = 0x271;
        local_3ee = Checksum;
        DecoderResult::DecoderResult(__return_storage_ptr__,(Error *)local_418);
LAB_0017a695:
        if (local_418 != (undefined1  [8])&local_408) {
          operator_delete((void *)local_418,
                          CONCAT44(local_408._M_allocated_capacity._4_4_,
                                   local_408._M_allocated_capacity._0_4_) + 1);
        }
        if (local_b0 != &local_a8._topLeft) {
          operator_delete(local_b0,CONCAT71(local_a8._topLeft._1_7_,local_a8._topLeft.m_hasValue) +
                                   1);
        }
        goto LAB_0017a6cf;
      }
      lVar16 = (long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      ppiVar21 = &((local_368.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_finish;
      lVar17 = 0;
      do {
        iVar11 = *(int *)((long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar17 * 4);
        if (iVar11 < (int)((ulong)((long)*ppiVar21 -
                                  (long)((_Vector_impl_data *)(ppiVar21 + -1))->_M_start) >> 2) + -1
           ) {
          *(int *)((long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar17 * 4) = iVar11 + 1;
          break;
        }
        *(int *)((long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar17 * 4) = 0;
        if (lVar16 + -1 == lVar17) {
          local_b0 = &local_a8._topLeft;
          local_a8._imgWidth = 0;
          local_a8._imgHeight = 0;
          local_418 = (undefined1  [8])&local_408;
          local_408._M_allocated_capacity._0_4_ =
               (uint)(uint3)local_408._M_allocated_capacity._1_3_ << 8;
          local_408._9_4_ = local_a8._topLeft.m_value.super_PointF.x._1_4_;
          local_408._13_2_ = local_a8._topLeft.m_value.super_PointF.x._5_2_;
          local_408._M_local_buf[0xf] = local_a8._topLeft.m_value.super_PointF.x._7_1_;
          uStack_410 = 0.0;
          local_a8._topLeft.m_hasValue = false;
          local_3f8 = "src/pdf417/PDFScanningDecoder.cpp";
          local_3f0 = 0x27b;
          local_3ee = Checksum;
          DecoderResult::DecoderResult(__return_storage_ptr__,(Error *)local_418);
          goto LAB_0017a695;
        }
        lVar17 = lVar17 + 1;
        ppiVar21 = ppiVar21 + 3;
      } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
      local_408._M_allocated_capacity._0_4_ = uVar6;
      local_408._M_allocated_capacity._4_4_ = uVar7;
      if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_p != &local_488) {
        operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
      }
      if (local_4c0._M_p != local_4b0) {
        operator_delete(local_4c0._M_p,(ulong)(local_4b0._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_p != local_4e0) {
        operator_delete(local_4f0._M_p,local_4e0[0]._M_allocated_capacity + 1);
      }
      pvVar4 = (void *)CONCAT17(local_518._M_local_buf[0xf],
                                CONCAT25(local_518._13_2_,
                                         CONCAT41(local_518._9_4_,local_518._M_local_buf[8])));
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,CONCAT53(uStack_4fd,CONCAT12(TStack_4fe,local_500)) - (long)pvVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_528._0_8_,
                        CONCAT71(local_518._M_allocated_capacity._1_7_,local_518._M_local_buf[0]) -
                        local_528._0_8_);
      }
      bVar8 = iVar12 != 0;
      iVar12 = iVar12 + -1;
    } while (bVar8);
    uStack_410 = 0.0;
    local_518._M_local_buf[0] = '\0';
    local_518._4_4_ = local_408._M_allocated_capacity._4_4_;
    local_518._M_allocated_capacity._1_3_ = local_408._M_allocated_capacity._1_3_;
    local_518._9_4_ = local_408._9_4_;
    local_518._13_2_ = local_408._13_2_;
    local_518._M_local_buf[0xf] = local_408._M_local_buf[0xf];
    stack0xfffffffffffffae0 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_408._M_allocated_capacity._0_4_ = local_408._M_allocated_capacity._0_4_ & 0xffffff00;
    local_508 = (pointer)0x19ca10;
    local_500 = 0x280;
    TStack_4fe = Checksum;
    local_528._0_8_ = &local_518;
    local_418 = (undefined1  [8])&local_408;
    DecoderResult::DecoderResult(__return_storage_ptr__,(Error *)local_528);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._0_8_ != &local_518) {
      operator_delete((void *)local_528._0_8_,
                      CONCAT71(local_518._M_allocated_capacity._1_7_,local_518._M_local_buf[0]) + 1)
      ;
    }
    if (local_418 != (undefined1  [8])&local_408) {
      uVar28 = CONCAT44(local_408._M_allocated_capacity._4_4_,local_408._M_allocated_capacity._0_4_)
               + 1;
      auVar32 = local_418;
LAB_0017a77d:
      operator_delete((void *)auVar32,uVar28);
    }
LAB_0017a782:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_548 != (void *)0x0) {
      operator_delete(local_548,(long)local_538 - (long)local_548);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_368);
    if (local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    memset(__return_storage_ptr__,0,0xd0);
    DecoderResult::DecoderResult(__return_storage_ptr__);
  }
  std::
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  ::~vector(&local_430);
LAB_0017a804:
  std::
  vector<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
  ::~vector(&local_348._detectionResultColumns);
  if (local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(local_268.m_value._codewords.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_268.m_value._codewords.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_268.m_value._codewords.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(local_1c8.m_value._codewords.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_1c8.m_value._codewords.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_1c8.m_value._codewords.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

DecoderResult
ScanningDecoder::Decode(const BitMatrix& image, const Nullable<ResultPoint>& imageTopLeft, const Nullable<ResultPoint>& imageBottomLeft,
	const Nullable<ResultPoint>& imageTopRight, const Nullable<ResultPoint>& imageBottomRight,
	int minCodewordWidth, int maxCodewordWidth)
{
	BoundingBox boundingBox;
	if (!BoundingBox::Create(image.width(), image.height(), imageTopLeft, imageBottomLeft, imageTopRight, imageBottomRight, boundingBox)) {
		return {};
	}
	
	Nullable<DetectionResultColumn> leftRowIndicatorColumn, rightRowIndicatorColumn;
	DetectionResult detectionResult;
	for (int i = 0; i < 2; i++) {
		if (imageTopLeft != nullptr) {
			leftRowIndicatorColumn = GetRowIndicatorColumn(image, boundingBox, imageTopLeft, true, minCodewordWidth, maxCodewordWidth);
		}
		if (imageTopRight != nullptr) {
			rightRowIndicatorColumn = GetRowIndicatorColumn(image, boundingBox, imageTopRight, false, minCodewordWidth, maxCodewordWidth);
		}
		if (!Merge(leftRowIndicatorColumn, rightRowIndicatorColumn, detectionResult)) {
			return {};
		}
		if (i == 0 && detectionResult.getBoundingBox() != nullptr && (detectionResult.getBoundingBox().value().minY() < boundingBox.minY() || detectionResult.getBoundingBox().value().maxY() > boundingBox.maxY())) {
			boundingBox = detectionResult.getBoundingBox();
		}
		else {
			detectionResult.setBoundingBox(boundingBox);
			break;
		}
	}

	int maxBarcodeColumn = detectionResult.barcodeColumnCount() + 1;
	detectionResult.setColumn(0, leftRowIndicatorColumn);
	detectionResult.setColumn(maxBarcodeColumn, rightRowIndicatorColumn);

	bool leftToRight = leftRowIndicatorColumn != nullptr;
	for (int barcodeColumnCount = 1; barcodeColumnCount <= maxBarcodeColumn; barcodeColumnCount++) {
		int barcodeColumn = leftToRight ? barcodeColumnCount : maxBarcodeColumn - barcodeColumnCount;
		if (detectionResult.column(barcodeColumn) != nullptr) {
			// This will be the case for the opposite row indicator column, which doesn't need to be decoded again.
			continue;
		}
		DetectionResultColumn::RowIndicator rowIndicator = barcodeColumn == 0 ? DetectionResultColumn::RowIndicator::Left : (barcodeColumn == maxBarcodeColumn ? DetectionResultColumn::RowIndicator::Right : DetectionResultColumn::RowIndicator::None);
		detectionResult.setColumn(barcodeColumn, DetectionResultColumn(boundingBox, rowIndicator));
		int startColumn = -1;
		int previousStartColumn = startColumn;
		// TODO start at a row for which we know the start position, then detect upwards and downwards from there.
		for (int imageRow = boundingBox.minY(); imageRow <= boundingBox.maxY(); imageRow++) {
			startColumn = GetStartColumn(detectionResult, barcodeColumn, imageRow, leftToRight);
			if (startColumn < 0 || startColumn > boundingBox.maxX()) {
				if (previousStartColumn == -1) {
					continue;
				}
				startColumn = previousStartColumn;
			}
			Nullable<Codeword> codeword = DetectCodeword(image, boundingBox.minX(), boundingBox.maxX(), leftToRight, startColumn, imageRow, minCodewordWidth, maxCodewordWidth);
			if (codeword != nullptr) {
				detectionResult.column(barcodeColumn).value().setCodeword(imageRow, codeword);
				previousStartColumn = startColumn;
				UpdateMinMax(minCodewordWidth, maxCodewordWidth, codeword.value().width());
			}
		}
	}
	return CreateDecoderResult(detectionResult);
}